

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::PoolingLayerParams::ByteSizeLong(PoolingLayerParams *this)

{
  uint32 uVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  int value;
  int value_00;
  
  sVar2 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->kernelsize_);
  value_00 = 0;
  if (sVar2 == 0) {
    value = 0;
    lVar4 = 0;
  }
  else {
    value = (int)sVar2;
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(value);
    lVar4 = sVar3 + 1;
  }
  this->_kernelsize_cached_byte_size_ = value;
  lVar4 = lVar4 + sVar2;
  sVar2 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->stride_);
  if (sVar2 != 0) {
    value_00 = (int)sVar2;
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(value_00);
    lVar4 = lVar4 + sVar3 + 2;
  }
  this->_stride_cached_byte_size_ = value_00;
  sVar2 = lVar4 + sVar2;
  if (this->type_ != 0) {
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->type_);
    sVar2 = sVar2 + sVar3 + 1;
  }
  sVar3 = sVar2 + 3;
  if (this->avgpoolexcludepadding_ == false) {
    sVar3 = sVar2;
  }
  sVar2 = sVar3 + 3;
  if (this->globalpooling_ == false) {
    sVar2 = sVar3;
  }
  uVar1 = this->_oneof_case_[0];
  if (uVar1 == 0x20) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::PoolingLayerParams_ValidCompletePadding>
                      ((this->PoolingPaddingType_).includelastpixel_);
  }
  else if (uVar1 == 0x1f) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::SamePadding>
                      ((this->PoolingPaddingType_).same_);
  }
  else {
    if (uVar1 != 0x1e) goto LAB_001c916b;
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::ValidPadding>
                      ((this->PoolingPaddingType_).valid_);
  }
  sVar2 = sVar2 + sVar3 + 2;
LAB_001c916b:
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t PoolingLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.PoolingLayerParams)
  size_t total_size = 0;

  // repeated uint64 kernelSize = 10;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->kernelsize_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _kernelsize_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated uint64 stride = 20;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->stride_);
    if (data_size > 0) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _stride_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.PoolingLayerParams.PoolingType type = 1;
  if (this->type() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->type());
  }

  // bool avgPoolExcludePadding = 50;
  if (this->avgpoolexcludepadding() != 0) {
    total_size += 2 + 1;
  }

  // bool globalPooling = 60;
  if (this->globalpooling() != 0) {
    total_size += 2 + 1;
  }

  switch (PoolingPaddingType_case()) {
    // .CoreML.Specification.ValidPadding valid = 30;
    case kValid: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *PoolingPaddingType_.valid_);
      break;
    }
    // .CoreML.Specification.SamePadding same = 31;
    case kSame: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *PoolingPaddingType_.same_);
      break;
    }
    // .CoreML.Specification.PoolingLayerParams.ValidCompletePadding includeLastPixel = 32;
    case kIncludeLastPixel: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *PoolingPaddingType_.includelastpixel_);
      break;
    }
    case POOLINGPADDINGTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}